

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
* boost::ext::di::v1_3_0::core::binder::
  resolve<std::unique_ptr<i1,std::default_delete<i1>>,__25,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,i1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,i1>>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,std::unique_ptr<i1,std::default_delete<i1>>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>
            (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
             *deps)

{
  dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *pdVar1;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *in_RDI;
  type<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_test_ft_di_injector_cpp:56:13),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_&>
  local_9 [9];
  
  pdVar1 = resolve_<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,i1>>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,std::unique_ptr<i1,std::default_delete<i1>>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,i1>>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<__25,std::unique_ptr<i1,std::default_delete<i1>>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
                     (in_RDI,local_9);
  return pdVar1;
}

Assistant:

static decltype(auto) resolve(TDeps* deps) noexcept {
    using dependency = dependency_concept<aux::decay_t<T>, TName>;
#if (defined(__CLANG__) && __CLANG__ >= 3'9)  //
    return resolve_(deps, aux::type<decltype(resolve_impl<TDefault, dependency>(aux::declval<TDeps*>()))>{});
#else
    return resolve_impl<TDefault, dependency>(deps);
#endif
  }